

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_math_lang.cpp
# Opt level: O2

Language * Omega_h::math_lang::build_language(void)

{
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *this;
  Language *in_RDI;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_28;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_29;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_31;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_33;
  allocator local_14f;
  allocator local_14e;
  allocator local_14d;
  allocator_type local_14c;
  allocator local_14b;
  allocator_type local_14a;
  allocator_type local_149;
  Production local_148;
  allocator_type local_10a;
  allocator local_109;
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &in_RDI->productions;
  std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::resize
            (this,0x27);
  std::__cxx11::string::string((string *)&local_148,"program",&local_14f);
  std::__cxx11::string::string((string *)local_108,"statements",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"expr?",&local_14e);
  __l._M_len = 2;
  __l._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l,&local_14c);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_108,"statements",(allocator *)&local_148);
  local_e8._16_8_ = (pointer)0x0;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::string((string *)&local_148,"statements",&local_14f);
  std::__cxx11::string::string((string *)local_108,"statements",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"statement",&local_14e);
  std::__cxx11::string::string(local_c8,";",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"S?",&local_14b);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_00,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"statement",&local_14f);
  std::__cxx11::string::string((string *)local_108,"name",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"S?",&local_14e);
  std::__cxx11::string::string(local_c8,"=",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"S?",&local_14b);
  std::__cxx11::string::string(local_88,"expr",(allocator *)&local_14a);
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_01,&local_149);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_108,"expr?",(allocator *)&local_148);
  local_e8._16_8_ = (pointer)0x0;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 4,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::string((string *)local_108,"expr?",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"expr",&local_14d);
  __l_02._M_len = 1;
  __l_02._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_02,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"expr",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"ternary",&local_14d);
  __l_03._M_len = 1;
  __l_03._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_03,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 6,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"ternary",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"add_sub",&local_14d);
  __l_04._M_len = 1;
  __l_04._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_04,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 7,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"or",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"and",&local_14d);
  __l_05._M_len = 1;
  __l_05._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_05,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 8,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"and",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"comp",&local_14d);
  __l_06._M_len = 1;
  __l_06._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_06,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 9,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"mul_div",&local_14d);
  __l_07._M_len = 1;
  __l_07._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_07,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 10,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"mul_div",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"neg",&local_14d);
  __l_08._M_len = 1;
  __l_08._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_08,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xb,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"neg",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"pow",&local_14d);
  __l_09._M_len = 1;
  __l_09._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_09,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xc,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"pow",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"scalar",&local_14d);
  __l_10._M_len = 1;
  __l_10._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_10,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xd,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_148,"ternary",&local_14f);
  std::__cxx11::string::string((string *)local_108,"or",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"?",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"add_sub",&local_14b);
  std::__cxx11::string::string(local_88,":",(allocator *)&local_14a);
  std::__cxx11::string::string(local_68,"S?",(allocator *)&local_149);
  std::__cxx11::string::string(local_48,"add_sub",&local_109);
  __l_11._M_len = 7;
  __l_11._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_11,&local_10a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xe,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"or",&local_14f);
  std::__cxx11::string::string((string *)local_108,"or",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"||",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"and",&local_14b);
  __l_12._M_len = 4;
  __l_12._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_12,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xf,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"and",&local_14f);
  std::__cxx11::string::string((string *)local_108,"and",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"&&",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"comp",&local_14b);
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_13,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x10,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"comp",&local_14f);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14d);
  std::__cxx11::string::string((string *)local_e8,">",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"add_sub",&local_14b);
  __l_14._M_len = 4;
  __l_14._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_14,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x11,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"comp",&local_14f);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"<",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"add_sub",&local_14b);
  __l_15._M_len = 4;
  __l_15._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_15,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x12,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"comp",&local_14f);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14d);
  std::__cxx11::string::string((string *)local_e8,">=",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"add_sub",&local_14b);
  __l_16._M_len = 4;
  __l_16._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_16,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x13,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"comp",&local_14f);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"<=",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"add_sub",&local_14b);
  __l_17._M_len = 4;
  __l_17._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_17,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x14,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"comp",&local_14f);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"==",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"add_sub",&local_14b);
  __l_18._M_len = 4;
  __l_18._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_18,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x15,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"comp",&local_14f);
  std::__cxx11::string::string((string *)local_108,"(",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"S?",&local_14e);
  std::__cxx11::string::string(local_c8,"or",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,")",&local_14b);
  std::__cxx11::string::string(local_88,"S?",(allocator *)&local_14a);
  __l_19._M_len = 5;
  __l_19._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_19,&local_149);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x16,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"add_sub",&local_14f);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"+",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"mul_div",&local_14b);
  __l_20._M_len = 4;
  __l_20._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_20,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x17,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"add_sub",&local_14f);
  std::__cxx11::string::string((string *)local_108,"add_sub",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"-",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"mul_div",&local_14b);
  __l_21._M_len = 4;
  __l_21._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_21,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x18,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"mul_div",&local_14f);
  std::__cxx11::string::string((string *)local_108,"mul_div",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"*",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"pow",&local_14b);
  __l_22._M_len = 4;
  __l_22._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_22,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x19,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"mul_div",&local_14f);
  std::__cxx11::string::string((string *)local_108,"mul_div",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"/",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"pow",&local_14b);
  __l_23._M_len = 4;
  __l_23._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_23,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1a,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"pow",&local_14f);
  std::__cxx11::string::string((string *)local_108,"scalar",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"^",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"pow",&local_14b);
  __l_24._M_len = 4;
  __l_24._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_24,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1b,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"scalar",&local_14f);
  std::__cxx11::string::string((string *)local_108,"name",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"S?",&local_14e);
  std::__cxx11::string::string(local_c8,"(",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"S?",&local_14b);
  std::__cxx11::string::string(local_88,"args?",(allocator *)&local_14a);
  std::__cxx11::string::string(local_68,")",(allocator *)&local_149);
  std::__cxx11::string::string(local_48,"S?",&local_109);
  __l_25._M_len = 7;
  __l_25._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_25,&local_10a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1c,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_108,"args?",(allocator *)&local_148);
  local_e8._16_8_ = (pointer)0x0;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1d,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::string((string *)local_108,"args?",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"args",&local_14d);
  __l_26._M_len = 1;
  __l_26._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_26,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1e,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)local_108,"args",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"ternary",&local_14d);
  __l_27._M_len = 1;
  __l_27._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_27,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1f,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_148,"args",&local_14f);
  std::__cxx11::string::string((string *)local_108,"args",&local_14d);
  std::__cxx11::string::string((string *)local_e8,",",&local_14e);
  std::__cxx11::string::string(local_c8,"S?",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,"ternary",&local_14b);
  __l_28._M_len = 4;
  __l_28._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_28,&local_14a);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x20,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"neg",&local_14f);
  std::__cxx11::string::string((string *)local_108,"-",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"S?",&local_14e);
  std::__cxx11::string::string(local_c8,"neg",(allocator *)&local_14c);
  __l_29._M_len = 3;
  __l_29._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_29,(allocator_type *)&local_14b);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x21,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"scalar",&local_14f);
  std::__cxx11::string::string((string *)local_108,"(",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"S?",&local_14e);
  std::__cxx11::string::string(local_c8,"ternary",(allocator *)&local_14c);
  std::__cxx11::string::string(local_a8,")",&local_14b);
  std::__cxx11::string::string(local_88,"S?",(allocator *)&local_14a);
  __l_30._M_len = 5;
  __l_30._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_30,&local_149);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x22,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"scalar",&local_14f);
  std::__cxx11::string::string((string *)local_108,"constant",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"S?",&local_14e);
  __l_31._M_len = 2;
  __l_31._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_31,&local_14c);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x23,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_148,"scalar",&local_14f);
  std::__cxx11::string::string((string *)local_108,"name",&local_14d);
  std::__cxx11::string::string((string *)local_e8,"S?",&local_14e);
  __l_32._M_len = 2;
  __l_32._M_array = (iterator)local_108;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_148.rhs,__l_32,&local_14c);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x24,&local_148);
  Language::Production::~Production(&local_148);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_108,"S?",(allocator *)&local_148);
  local_e8._16_8_ = (pointer)0x0;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (pointer)0x0;
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x25,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::string((string *)local_108,"S?",&local_14f);
  std::__cxx11::string::string((string *)&local_148,"spaces",&local_14d);
  __l_33._M_len = 1;
  __l_33._M_array = &local_148.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8,__l_33,(allocator_type *)&local_14e);
  Language::Production::operator=
            ((in_RDI->productions).
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x26,(Production *)local_108);
  Language::Production::~Production((Production *)local_108);
  std::__cxx11::string::~string((string *)&local_148);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&in_RDI->tokens,0x16);
  std::__cxx11::string::string((string *)local_108,"spaces",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"[ \t\n\r]+",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"name",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"[_a-zA-Z][_a-zA-Z0-9]*",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"+",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\+",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"-",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\-",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"*",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\*",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"/",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\/",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"^",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\^",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 6,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"(",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\(",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 7,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,")",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\)",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,",",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,",",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 9,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"?",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\?",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,":",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,":",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,">",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,">",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"<",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"<",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,">=",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,">=",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"<=",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"<=",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xf,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"==",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"==",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x10,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"&&",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"&&",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x11,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"||",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"\\|\\|",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x12,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"constant",(allocator *)&local_148);
  std::__cxx11::string::string
            ((string *)local_e8,"(0|([1-9][0-9]*))(\\.[0-9]*)?([eE][\\-\\+]?[0-9]+)?",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x13,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,";",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,";",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x14,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  std::__cxx11::string::string((string *)local_108,"=",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_e8,"=",&local_14f);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x15,(Token *)local_108);
  Language::Token::~Token((Token *)local_108);
  return in_RDI;
}

Assistant:

Language build_language() {
  Language out;
  auto& prods = out.productions;
  prods.resize(NPRODS);
  prods[PROD_PROGRAM] = {"program", {"statements", "expr?"}};
  prods[PROD_NO_STATEMENTS] = {"statements", {}};
  prods[PROD_NEXT_STATEMENT] = {
      "statements", {"statements", "statement", ";", "S?"}};
  prods[PROD_ASSIGN] = {"statement", {"name", "S?", "=", "S?", "expr"}};
  prods[PROD_NO_EXPR] = {"expr?", {}};
  prods[PROD_YES_EXPR] = {"expr?", {"expr"}};
  prods[PROD_EXPR] = {"expr", {"ternary"}};
  prods[PROD_TERNARY_DECAY] = {"ternary", {"add_sub"}};
  prods[PROD_OR_DECAY] = {"or", {"and"}};
  prods[PROD_AND_DECAY] = {"and", {"comp"}};
  prods[PROD_ADD_SUB_DECAY] = {"add_sub", {"mul_div"}};
  prods[PROD_MUL_DIV_DECAY] = {"mul_div", {"neg"}};
  prods[PROD_NEG_DECAY] = {"neg", {"pow"}};
  prods[PROD_POW_DECAY] = {"pow", {"scalar"}};
  prods[PROD_TERNARY] = {
      "ternary", {"or", "?", "S?", "add_sub", ":", "S?", "add_sub"}};
  prods[PROD_OR] = {"or", {"or", "||", "S?", "and"}};
  prods[PROD_AND] = {"and", {"and", "&&", "S?", "comp"}};
  prods[PROD_GT] = {"comp", {"add_sub", ">", "S?", "add_sub"}};
  prods[PROD_LT] = {"comp", {"add_sub", "<", "S?", "add_sub"}};
  prods[PROD_GEQ] = {"comp", {"add_sub", ">=", "S?", "add_sub"}};
  prods[PROD_LEQ] = {"comp", {"add_sub", "<=", "S?", "add_sub"}};
  prods[PROD_EQ] = {"comp", {"add_sub", "==", "S?", "add_sub"}};
  prods[PROD_BOOL_PARENS] = {"comp", {"(", "S?", "or", ")", "S?"}};
  prods[PROD_ADD] = {"add_sub", {"add_sub", "+", "S?", "mul_div"}};
  prods[PROD_SUB] = {"add_sub", {"add_sub", "-", "S?", "mul_div"}};
  prods[PROD_MUL] = {"mul_div", {"mul_div", "*", "S?", "pow"}};
  prods[PROD_DIV] = {"mul_div", {"mul_div", "/", "S?", "pow"}};
  prods[PROD_POW] = {"pow", {"scalar", "^", "S?", "pow"}};
  prods[PROD_CALL] = {"scalar", {"name", "S?", "(", "S?", "args?", ")", "S?"}};
  prods[PROD_NO_ARGS] = {"args?", {}};
  prods[PROD_SOME_ARGS] = {"args?", {"args"}};
  prods[PROD_FIRST_ARG] = {"args", {"ternary"}};
  prods[PROD_NEXT_ARG] = {"args", {"args", ",", "S?", "ternary"}};
  prods[PROD_NEG] = {"neg", {"-", "S?", "neg"}};
  prods[PROD_VAL_PARENS] = {"scalar", {"(", "S?", "ternary", ")", "S?"}};
  prods[PROD_CONST] = {"scalar", {"constant", "S?"}};
  prods[PROD_VAR] = {"scalar", {"name", "S?"}};
  prods[PROD_NO_SPACES] = {"S?", {}};
  prods[PROD_SPACES] = {"S?", {"spaces"}};
  out.tokens.resize(NTOKS);
  out.tokens[TOK_SPACE] = {"spaces", "[ \t\n\r]+"};
  out.tokens[TOK_NAME] = {"name", "[_a-zA-Z][_a-zA-Z0-9]*"};
  out.tokens[TOK_ADD] = {"+", "\\+"};
  out.tokens[TOK_SUB] = {"-", "\\-"};
  out.tokens[TOK_MUL] = {"*", "\\*"};
  out.tokens[TOK_DIV] = {"/", "\\/"};
  out.tokens[TOK_POW] = {"^", "\\^"};
  out.tokens[TOK_LPAREN] = {"(", "\\("};
  out.tokens[TOK_RPAREN] = {")", "\\)"};
  out.tokens[TOK_COMMA] = {",", ","};
  out.tokens[TOK_CHECK] = {"?", "\\?"};
  out.tokens[TOK_CHOOSE] = {":", ":"};
  out.tokens[TOK_GT] = {">", ">"};
  out.tokens[TOK_LT] = {"<", "<"};
  out.tokens[TOK_GEQ] = {">=", ">="};
  out.tokens[TOK_LEQ] = {"<=", "<="};
  out.tokens[TOK_EQ] = {"==", "=="};
  out.tokens[TOK_AND] = {"&&", "&&"};
  out.tokens[TOK_OR] = {"||", "\\|\\|"};
  out.tokens[TOK_CONST] = {
      "constant", "(0|([1-9][0-9]*))(\\.[0-9]*)?([eE][\\-\\+]?[0-9]+)?"};
  out.tokens[TOK_SEMICOLON] = {";", ";"};
  out.tokens[TOK_ASSIGN] = {"=", "="};
  return out;
}